

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_bool> pVar1;
  OStringStream oss;
  String local_1b0;
  ValueHolder local_190 [47];
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)local_190,arrayValue);
    swap((Value *)local_190,this);
    ~Value((Value *)local_190);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190[0].bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190[0].bool_,"in Json::Value::append: requires arrayValue",0x2b);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
  }
  this_00 = (_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
             *)(this->value_).map_;
  local_190[0]._0_4_ = size(this);
  pVar1 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_unique<unsigned_int,Json::Value>(this_00,(uint *)&local_190[0].uint_,value);
  return (Value *)&pVar1.first._M_node._M_node[1]._M_left;
}

Assistant:

Value& Value::append(Value&& value) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::append: requires arrayValue");
  if (type() == nullValue) {
    *this = Value(arrayValue);
  }
  return this->value_.map_->emplace(size(), std::move(value)).first->second;
}